

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DIS_Logger_Playback.cpp
# Opt level: O0

void __thiscall KDIS::UTILS::DIS_Logger_Playback::loadFromFile(DIS_Logger_Playback *this)

{
  ushort uVar1;
  byte bVar2;
  KException *this_00;
  size_type sVar3;
  undefined1 local_88 [8];
  Log l;
  allocator<char> local_31;
  KString local_30;
  DIS_Logger_Playback *local_10;
  DIS_Logger_Playback *this_local;
  
  local_10 = this;
  bVar2 = std::fstream::is_open();
  if ((bVar2 & 1) == 0) {
    l.sData.field_2._M_local_buf[0xb] = '\x01';
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"loadFromFile",&local_31)
    ;
    KException::KException(this_00,&local_30,6);
    l.sData.field_2._M_local_buf[0xb] = '\0';
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  Log::Log((Log *)local_88);
  do {
    bVar2 = std::ios::eof();
    if ((bVar2 & 1) != 0) break;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)this,(string *)local_88);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)this,(string *)(l.sStamp.field_2._M_local_buf + 8));
    std::
    queue<KDIS::UTILS::DIS_Logger_Playback::Log,_std::deque<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>_>
    ::push(&this->m_qLog,(value_type *)local_88);
  } while ((this->m_ui16PreLoadLines == 0) ||
          (uVar1 = this->m_ui16PreLoadLines,
          sVar3 = std::
                  queue<KDIS::UTILS::DIS_Logger_Playback::Log,_std::deque<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>_>
                  ::size(&this->m_qLog), uVar1 < sVar3));
  Log::~Log((Log *)local_88);
  return;
}

Assistant:

void DIS_Logger_Playback::loadFromFile() noexcept(false)
{
    if( m_File.is_open() == false )throw KException( __FUNCTION__, FILE_NOT_OPEN );

    Log l;

    while( m_File.eof() == false )
    {
        getline( m_File, l.sStamp );
        getline( m_File, l.sData );

        m_qLog.push( l );

        if( m_ui16PreLoadLines != 0 )
        {
            if( m_ui16PreLoadLines >= m_qLog.size() )break;
        }
    }
}